

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_codepoint<4ul,char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char prefix,uint32_t cp)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  char buf [4];
  char local_1c [4];
  
  sVar2 = (out.container)->size_;
  uVar4 = sVar2 + 1;
  if ((out.container)->capacity_ < uVar4) {
    (*(out.container)->grow_)(out.container,uVar4);
    sVar2 = (out.container)->size_;
    uVar4 = sVar2 + 1;
  }
  (out.container)->size_ = uVar4;
  (out.container)->ptr_[sVar2] = '\\';
  sVar2 = (out.container)->size_;
  uVar4 = sVar2 + 1;
  if ((out.container)->capacity_ < uVar4) {
    (*(out.container)->grow_)(out.container,uVar4);
    sVar2 = (out.container)->size_;
    uVar4 = sVar2 + 1;
  }
  (out.container)->size_ = uVar4;
  (out.container)->ptr_[sVar2] = prefix;
  builtin_strncpy(local_1c,"0000",4);
  pcVar3 = local_1c + 3;
  do {
    *pcVar3 = "0123456789abcdef"[cp & 0xf];
    pcVar3 = pcVar3 + -1;
    bVar1 = 0xf < cp;
    cp = cp >> 4;
  } while (bVar1);
  buffer<char>::append<char>(out.container,local_1c,&stack0xffffffffffffffe8);
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_base2e(4, buf, cp, width);
  return copy<Char>(buf, buf + width, out);
}